

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O1

fdb_status fdb_set(fdb_kvs_handle *handle,fdb_doc *doc)

{
  short sVar1;
  ushort uVar2;
  fdb_kvs_id_t fVar3;
  size_t __n;
  docio_handle *handle_00;
  fdb_kvs_handle *pfVar4;
  list *list;
  btreeblk_handle *pbVar5;
  filemgr *pfVar6;
  byte bVar7;
  undefined6 uVar8;
  undefined8 __src;
  filemgr_dirty_update_node *pfVar9;
  filemgr_dirty_update_node *new_node_00;
  fdb_txn *pfVar10;
  wal_dirty_t wVar11;
  ushort uVar12;
  uint32_t __useconds;
  fdb_status fVar13;
  uint uVar14;
  fdb_status fVar15;
  fdb_seqnum_t fVar16;
  bid_t offset;
  filemgr *pfVar17;
  void *pvVar18;
  size_t sVar19;
  undefined8 extraout_RAX;
  char cVar20;
  long lVar21;
  fdb_doc *doc_00;
  undefined1 *buf;
  fdb_doc *pfVar22;
  fdb_doc *pfVar23;
  ulong uVar24;
  void *__dest;
  bool bVar25;
  byte bVar26;
  char *pcStack_160;
  undefined1 local_158 [8];
  fdb_doc kv_ins_doc;
  timeval tv;
  _fdb_key_cmp_info cmp_info;
  bid_t local_c8;
  bid_t dirty_idtree_root;
  bid_t dirty_seqtree_root;
  docio_object _doc;
  filemgr_dirty_update_node *local_78;
  filemgr_dirty_update_node *prev_node;
  filemgr_dirty_update_node *new_node;
  undefined4 local_5c;
  ulong local_58;
  uint local_4c;
  fdb_txn *local_48;
  uint local_3c;
  filemgr *local_38;
  
  bVar26 = 0;
  buf = local_158;
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar15 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    dirty_seqtree_root._0_2_ = 0;
    dirty_seqtree_root._2_2_ = 0;
    dirty_seqtree_root._4_4_ = 0;
    _doc.length.keylen = 0;
    _doc.length.metalen = 0;
    _doc.length.bodylen._0_1_ = '\0';
    _doc.length.bodylen._1_1_ = '\0';
    _doc.length.bodylen._2_2_ = 0;
    _doc.length.bodylen_ondisk = 0;
    _doc.timestamp = 0;
    _doc._20_4_ = 0;
    _doc.key = (void *)0x0;
    _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)0x0;
    _doc.meta = (void *)0x0;
    if (((handle->config).flags & 2) == 0) {
      fVar15 = FDB_RESULT_INVALID_ARGS;
      if ((((((doc != (fdb_doc *)0x0) && (doc->key != (void *)0x0)) &&
            (0xffffffffffff007f < doc->keylen - 0xff81)) &&
           ((local_48 = handle->fhandle->root->txn, doc->metalen == 0 || (doc->meta != (void *)0x0))
           )) && ((doc->bodylen == 0 || (doc->body != (void *)0x0)))) &&
         (((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0 ||
          (doc->keylen <= (ulong)((handle->config).blocksize - 0x100))))) {
        LOCK();
        bVar25 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
        if (bVar25) {
          (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
        }
        UNLOCK();
        fVar15 = FDB_RESULT_HANDLE_BUSY;
        if (bVar25) {
          sVar1 = (short)doc->keylen;
          dirty_seqtree_root._0_4_ = CONCAT22((short)doc->metalen,sVar1);
          if (doc->deleted == false) {
            dirty_seqtree_root = CONCAT44((int)doc->bodylen,(uint)dirty_seqtree_root);
            _doc._16_8_ = doc->key;
            _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)doc->meta;
            _doc.meta = doc->body;
          }
          else {
            dirty_seqtree_root = (bid_t)(uint)dirty_seqtree_root;
            _doc._16_8_ = doc->key;
            _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)doc->meta;
            _doc.meta = (void *)0x0;
          }
          _doc.key = (void *)0x0;
          _doc.length.keylen = 0;
          _doc.length.metalen = 0;
          _doc.length.bodylen = 0;
          if (handle->kvs == (kvs_info *)0x0) {
            local_5c = 0;
          }
          else {
            uVar2 = (handle->config).chunksize;
            uVar12 = sVar1 + uVar2;
            uVar8 = (undefined6)(dirty_seqtree_root >> 0x10);
            dirty_seqtree_root._2_2_ = (short)uVar8;
            dirty_seqtree_root._4_4_ = (int)((uint6)uVar8 >> 0x10);
            dirty_seqtree_root._0_2_ = uVar12;
            _doc.length.keylen = 0;
            _doc.length.metalen = 0;
            _doc.length.bodylen = 0;
            lVar21 = -(ulong)(uVar12 + 0xf & 0xfffffff0);
            buf = local_158 + lVar21;
            _doc.key = (void *)0x0;
            _doc._16_8_ = buf;
            fVar3 = handle->kvs->id;
            *(undefined8 *)((long)&pcStack_160 + lVar21) = 0x123f2b;
            kvid2buf((ulong)uVar2,fVar3,buf);
            __dest = (void *)((ulong)uVar2 + _doc._16_8_);
            __n = doc->keylen;
            pvVar18 = doc->key;
            *(undefined8 *)((long)&pcStack_160 + lVar21) = 0x123f41;
            memcpy(__dest,pvVar18,__n);
            local_5c = (undefined4)
                       CONCAT71((int7)((ulong)handle->kvs >> 8),handle->kvs->type == '\x01');
          }
          local_3c = 0;
          uVar24 = 0;
          local_4c = 0;
          do {
            doc_00 = (fdb_doc *)local_158;
            *(undefined8 *)(buf + -8) = 0x123f87;
            fdb_check_file_reopen(handle,(file_status_t *)0x0);
            pfVar17 = handle->file;
            *(undefined8 *)(buf + -8) = 0x123f90;
            __useconds = filemgr_get_throttling_delay(pfVar17);
            if (__useconds != 0) {
              *(undefined8 *)(buf + -8) = 0x123f9b;
              usleep(__useconds);
            }
            tv.tv_usec = *(__suseconds_t *)&handle->kvs_config;
            pfVar17 = handle->file;
            *(undefined8 *)(buf + -8) = 0x123fc6;
            filemgr_mutex_lock(pfVar17);
            *(undefined8 *)(buf + -8) = 0x123fce;
            fdb_sync_db_header(handle);
            pfVar17 = handle->file;
            *(undefined8 *)(buf + -8) = 0x123fd7;
            bVar25 = filemgr_is_rollback_on(pfVar17);
            pfVar17 = handle->file;
            if (bVar25) {
              *(undefined8 *)(buf + -8) = 0x123fe4;
              filemgr_mutex_unlock(pfVar17);
              bVar25 = false;
              LOCK();
              if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
              }
              UNLOCK();
              fVar15 = FDB_RESULT_FAIL_BY_ROLLBACK;
            }
            else {
              handle_00 = handle->dhandle;
              local_58 = uVar24;
              if ((pfVar17->status).super___atomic_base<unsigned_char>._M_i == '\x04') {
                *(undefined8 *)(buf + -8) = 0x124014;
                filemgr_mutex_unlock(pfVar17);
                bVar25 = true;
              }
              else {
                local_38 = pfVar17;
                if ((char)local_5c == '\0') {
                  *(undefined8 *)(buf + -8) = 0x12406d;
                  fVar16 = filemgr_get_seqnum(pfVar17);
                  pfVar17 = local_38;
                  uVar24 = doc->seqnum;
                  if ((uVar24 != 0xffffffffffffffff) && ((doc->flags & 1) != 0)) {
                    if (fVar16 < uVar24) {
                      handle->seqnum = uVar24;
                      *(undefined8 *)(buf + -8) = 0x1240ce;
                      filemgr_set_seqnum(pfVar17,uVar24);
                    }
                    goto LAB_001240ce;
                  }
                  fVar16 = fVar16 + 1;
                  doc->seqnum = fVar16;
                  handle->seqnum = fVar16;
                  *(undefined8 *)(buf + -8) = 0x124098;
                  filemgr_set_seqnum(pfVar17,fVar16);
                }
                else {
                  fVar3 = handle->kvs->id;
                  *(undefined8 *)(buf + -8) = 0x124033;
                  fVar16 = fdb_kvs_get_seqnum(pfVar17,fVar3);
                  pfVar17 = local_38;
                  uVar24 = doc->seqnum;
                  if ((uVar24 == 0xffffffffffffffff) || ((doc->flags & 1) == 0)) {
                    fVar16 = fVar16 + 1;
                    doc->seqnum = fVar16;
                    handle->seqnum = fVar16;
                    fVar3 = handle->kvs->id;
                    *(undefined8 *)(buf + -8) = 0x124066;
                    fdb_kvs_set_seqnum(pfVar17,fVar3,fVar16);
                  }
                  else {
                    if (fVar16 < uVar24) {
                      handle->seqnum = uVar24;
                      fVar3 = handle->kvs->id;
                      *(undefined8 *)(buf + -8) = 0x1240b7;
                      fdb_kvs_set_seqnum(pfVar17,fVar3,uVar24);
                    }
LAB_001240ce:
                    *(byte *)&doc->flags = (byte)doc->flags & 0xfe;
                  }
                }
                _doc.key = (void *)doc->seqnum;
                if (doc->deleted == true) {
                  *(undefined8 *)(buf + -8) = 0x1240f3;
                  gettimeofday((timeval *)&kv_ins_doc.deleted,(__timezone_ptr_t)0x0);
                  _doc.length.bodylen_ondisk = kv_ins_doc._72_4_;
                }
                else {
                  _doc.length.bodylen_ondisk = 0;
                }
                local_4c = local_4c & 0xff;
                if (local_48 != (fdb_txn *)0x0) {
                  local_4c = 1;
                }
                bVar25 = doc->deleted;
                bVar7 = (byte)local_4c;
                *(undefined8 *)(buf + -8) = 0x124138;
                offset = docio_append_doc(handle_00,(docio_object *)&dirty_seqtree_root,bVar25,
                                          bVar7 & 1);
                pfVar17 = local_38;
                if (offset != 0xffffffffffffffff) {
                  if ((doc->deleted == true) &&
                     (local_3c = local_3c & 0xff, (handle->config).purging_interval == 0)) {
                    local_3c = 1;
                  }
                  new_node = (filemgr_dirty_update_node *)&local_38->global_txn;
                  doc->size_ondisk =
                       (ulong)(((uint)dirty_seqtree_root & 0xffff) +
                               ((uint)dirty_seqtree_root >> 0x10) + _doc.length._0_4_) + 0x20;
                  doc->offset = offset;
                  if (local_48 == (fdb_txn *)0x0) {
                    local_48 = (fdb_txn *)new_node;
                  }
                  if ((handle->config).bottom_up_index_build == true) {
                    *(undefined8 *)(buf + -8) = 0x1241c0;
                    pfVar17 = (filemgr *)malloc(0x30);
                    uVar24 = (ulong)(keylen_t)dirty_seqtree_root;
                    (pfVar17->pos).super___atomic_base<unsigned_long>._M_i = uVar24;
                    *(undefined8 *)(buf + -8) = 0x1241d7;
                    pvVar18 = malloc(uVar24);
                    *(void **)&pfVar17->blocksize = pvVar18;
                    __src = _doc._16_8_;
                    *(undefined8 *)(buf + -8) = 0x1241ed;
                    memcpy(pvVar18,(void *)__src,uVar24);
                    (pfVar17->last_commit).super___atomic_base<unsigned_long>._M_i = doc->seqnum;
                    (pfVar17->latest_filesize).super___atomic_base<unsigned_long>._M_i = offset;
                    pfVar4 = handle->fhandle->root;
                    list = (pfVar4->bub_ctx).entries;
                    *(undefined8 *)(buf + -8) = 0x124217;
                    list_push_back(list,(list_elem *)pfVar17);
                    sVar19 = doc->size_ondisk;
                    (pfVar4->bub_ctx).num_entries = (pfVar4->bub_ctx).num_entries + 1;
                    (pfVar4->bub_ctx).space_used = sVar19 + (pfVar4->bub_ctx).space_used;
                  }
                  else {
                    if (handle->kvs == (kvs_info *)0x0) {
                      doc_00 = doc;
                      if ((local_3c & 1) != 0) goto LAB_001242d0;
LAB_001242fe:
                      pfVar10 = local_48;
                      *(undefined8 *)(buf + -8) = 0x124306;
                      wal_insert(pfVar10,pfVar17,(_fdb_key_cmp_info *)&tv.tv_usec,doc_00,offset,0);
                    }
                    else {
                      pfVar22 = doc;
                      pfVar23 = doc_00;
                      for (lVar21 = 10; lVar21 != 0; lVar21 = lVar21 + -1) {
                        pfVar23->keylen = pfVar22->keylen;
                        pfVar22 = (fdb_doc *)((long)pfVar22 + (ulong)bVar26 * -0x10 + 8);
                        pfVar23 = (fdb_doc *)((long)pfVar23 + (ulong)bVar26 * -0x10 + 8);
                      }
                      kv_ins_doc.size_ondisk = _doc._16_8_;
                      local_158 = (undefined1  [8])(ulong)(keylen_t)dirty_seqtree_root;
                      if ((local_3c & 1) == 0) goto LAB_001242fe;
LAB_001242d0:
                      pfVar10 = local_48;
                      *(undefined8 *)(buf + -8) = 0x1242d8;
                      wal_immediate_remove
                                (pfVar10,pfVar17,(_fdb_key_cmp_info *)&tv.tv_usec,doc_00,offset,0);
                    }
                    *(undefined8 *)(buf + -8) = 0x12430e;
                    wVar11 = wal_get_dirty_status(pfVar17);
                    pfVar6 = local_38;
                    if (wVar11 == '\0') {
                      *(undefined8 *)(buf + -8) = 0x124322;
                      wal_set_dirty_status(pfVar6,'\x01',false);
                    }
                  }
                  pfVar6 = local_38;
                  if ((handle->config).auto_commit == true) {
                    *(undefined8 *)(buf + -8) = 0x124334;
                    sVar19 = wal_get_num_flushable(pfVar6);
                    uVar24 = CONCAT71((int7)((ulong)pfVar17 >> 8),1);
                    pfVar17 = local_38;
                    if (sVar19 <= (handle->config).wal_threshold) goto LAB_00124348;
                  }
                  else {
LAB_00124348:
                    pfVar17 = local_38;
                    uVar24 = local_58;
                    if ((handle->config).wal_flush_before_commit == true) {
                      local_c8 = 0xffffffffffffffff;
                      dirty_idtree_root = 0xffffffffffffffff;
                      if ((local_4c & 1) == 0) {
                        handle->dirty_updates = '\x01';
                      }
                      *(undefined8 *)(buf + -8) = 0x12437f;
                      sVar19 = wal_get_num_flushable(pfVar17);
                      pfVar9 = new_node;
                      cVar20 = '\x01';
                      if ((handle->config).wal_threshold < sVar19) {
                        *(undefined8 *)(buf + -8) = 0x12439f;
                        fVar13 = wal_commit((fdb_txn *)pfVar9,pfVar17,(wal_commit_mark_func *)0x0,
                                            &handle->log_callback);
                        if (fVar13 == FDB_RESULT_SUCCESS) {
                          local_78 = (filemgr_dirty_update_node *)0x0;
                          prev_node = (filemgr_dirty_update_node *)0x0;
                          *(undefined8 *)(buf + -8) = 0x124408;
                          _fdb_dirty_update_ready
                                    (handle,&local_78,&prev_node,&local_c8,&dirty_idtree_root,true);
                          *(undefined1 **)(buf + -0x10) = local_158;
                          *(undefined8 *)(buf + -0x18) = 0x12443b;
                          fVar13 = wal_flush(pfVar17,handle,_fdb_wal_flush_func,
                                             _fdb_wal_get_old_offset,_fdb_wal_flush_seq_purge,
                                             _fdb_wal_flush_kvs_delta_stats,
                                             *(wal_flush_items **)(buf + -0x10));
                          new_node_00 = prev_node;
                          pfVar9 = local_78;
                          new_node = (filemgr_dirty_update_node *)
                                     CONCAT44(new_node._4_4_,
                                              CONCAT31((int3)((uint)fVar13 >> 8),
                                                       fVar13 == FDB_RESULT_SUCCESS));
                          if (fVar13 == FDB_RESULT_SUCCESS) {
                            *(undefined8 *)(buf + -8) = 0x1244b1;
                            _fdb_dirty_update_finalize
                                      (handle,pfVar9,new_node_00,&local_c8,&dirty_idtree_root,false)
                            ;
                            *(undefined8 *)(buf + -8) = 0x1244c0;
                            wal_set_dirty_status(pfVar17,'\x02',false);
                            *(undefined8 *)(buf + -8) = 0x1244cf;
                            wal_release_flushed_items(pfVar17,(wal_flush_items *)local_158);
                            pbVar5 = handle->bhandle;
                            *(undefined8 *)(buf + -8) = 0x1244d8;
                            btreeblk_reset_subblock_info(pbVar5);
                            uVar14 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                          }
                          else {
                            pbVar5 = handle->bhandle;
                            pbVar5->dirty_update = (filemgr_dirty_update_node *)0x0;
                            pbVar5->dirty_update_writer = (filemgr_dirty_update_node *)0x0;
                            pfVar6 = handle->file;
                            *(undefined8 *)(buf + -8) = 0x124466;
                            filemgr_dirty_update_close_node(pfVar6,pfVar9);
                            pfVar9 = prev_node;
                            pfVar6 = handle->file;
                            *(undefined8 *)(buf + -8) = 0x124473;
                            filemgr_dirty_update_remove_node(pfVar6,pfVar9);
                            *(undefined8 *)(buf + -8) = 0x12447b;
                            filemgr_mutex_unlock(pfVar17);
                            LOCK();
                            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i ==
                                '\x01') {
                              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                            }
                            UNLOCK();
                            uVar14 = (uint)local_58;
                            fVar15 = fVar13;
                          }
                          cVar20 = (char)new_node;
                        }
                        else {
                          *(undefined8 *)(buf + -8) = 0x1243ae;
                          filemgr_mutex_unlock(pfVar17);
                          LOCK();
                          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i ==
                              '\x01') {
                            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                          }
                          UNLOCK();
                          uVar14 = (uint)local_58;
                          fVar15 = fVar13;
                          cVar20 = '\0';
                        }
                        uVar24 = (ulong)uVar14;
                        pfVar17 = local_38;
                      }
                      if (cVar20 == '\0') {
                        bVar25 = false;
                        goto LAB_00124544;
                      }
                    }
                    else {
                      uVar24 = local_58 & 0xffffffff;
                    }
                  }
                  *(undefined8 *)(buf + -8) = 0x1244ed;
                  filemgr_mutex_unlock(pfVar17);
                  if (doc->deleted == false) {
                    LOCK();
                    (handle->op_stats->num_sets).super___atomic_base<unsigned_long>._M_i =
                         (handle->op_stats->num_sets).super___atomic_base<unsigned_long>._M_i + 1;
                    UNLOCK();
                  }
                  if (((uVar24 & 1) == 0) || ((handle->config).auto_commit != true)) {
                    bVar25 = false;
                    LOCK();
                    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                    }
                    UNLOCK();
                    fVar15 = FDB_RESULT_SUCCESS;
                  }
                  else {
                    bVar25 = false;
                    LOCK();
                    if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                      (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                    }
                    UNLOCK();
                    pfVar4 = handle->fhandle->root;
                    *(undefined8 *)(buf + -8) = 0x124529;
                    fVar15 = _fdb_commit(pfVar4,'\0',false);
                  }
                  goto LAB_00124544;
                }
                *(undefined8 *)(buf + -8) = 0x12424f;
                filemgr_mutex_unlock(pfVar17);
                bVar25 = false;
                LOCK();
                if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
                  (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
                }
                UNLOCK();
                fVar15 = FDB_RESULT_WRITE_FAIL;
              }
              uVar24 = local_58 & 0xffffffff;
            }
LAB_00124544:
          } while (bVar25);
        }
      }
    }
    else {
      pcStack_160 = handle->file->filename;
      fVar15 = fdb_log_impl(&handle->log_callback,3,FDB_RESULT_RONLY_VIOLATION,
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/forestdb.cc"
                            ,"fdb_set",0x1025,
                            "Warning: SET is not allowed on the read-only DB file \'%s\'.");
    }
  }
  return fVar15;
}

Assistant:

LIBFDB_API
fdb_status fdb_set(fdb_kvs_handle *handle, fdb_doc *doc)
{
    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    uint64_t offset;
    struct docio_object _doc;
    struct filemgr *file;
    struct docio_handle *dhandle;
    struct timeval tv;
    bool txn_enabled = false;
    bool sub_handle = false;
    bool wal_flushed = false;
    bool immediate_remove = false;
    file_status_t fstatus;
    fdb_txn *txn = handle->fhandle->root->txn;
    struct _fdb_key_cmp_info cmp_info;
    fdb_status wr = FDB_RESULT_SUCCESS;
    LATENCY_STAT_START();

    if (handle->config.flags & FDB_OPEN_FLAG_RDONLY) {
        return fdb_log(&handle->log_callback, FDB_LOG_WARNING,
                       FDB_RESULT_RONLY_VIOLATION,
                       "Warning: SET is not allowed on the read-only DB file '%s'.",
                       handle->file->filename);
    }

    if (!doc || doc->key == NULL ||
        doc->keylen == 0 || doc->keylen > FDB_MAX_KEYLEN ||
        (doc->metalen > 0 && doc->meta == NULL) ||
        (doc->bodylen > 0 && doc->body == NULL) ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    _doc.length.keylen = doc->keylen;
    _doc.length.metalen = doc->metalen;
    _doc.length.bodylen = doc->deleted ? 0 : doc->bodylen;
    _doc.key = doc->key;
    _doc.meta = doc->meta;
    _doc.body = doc->deleted ? NULL : doc->body;

    if (handle->kvs) {
        // multi KV instance mode
        // allocate more (temporary) space for key, to store ID number
        int size_chunk = handle->config.chunksize;
        _doc.length.keylen = doc->keylen + size_chunk;
        _doc.key = alca(uint8_t, _doc.length.keylen);
        // copy ID
        kvid2buf(size_chunk, handle->kvs->id, _doc.key);
        // copy key
        memcpy((uint8_t*)_doc.key + size_chunk, doc->key, doc->keylen);

        if (handle->kvs->type == KVS_SUB) {
            sub_handle = true;
        } else {
            sub_handle = false;
        }
    }

fdb_set_start:
    fdb_check_file_reopen(handle, NULL);

    size_t throttling_delay = filemgr_get_throttling_delay(handle->file);
    if (throttling_delay) {
        usleep(throttling_delay);
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;

    filemgr_mutex_lock(handle->file);
    fdb_sync_db_header(handle);

    if (filemgr_is_rollback_on(handle->file)) {
        filemgr_mutex_unlock(handle->file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_FAIL_BY_ROLLBACK;
    }

    file = handle->file;
    dhandle = handle->dhandle;

    fstatus = filemgr_get_file_status(file);
    if (fstatus == FILE_REMOVED_PENDING) {
        // we must not write into this file
        // file status was changed by other thread .. start over
        filemgr_mutex_unlock(file);
        goto fdb_set_start;
    }

    if (sub_handle) {
        // multiple KV instance mode AND sub handle
        fdb_seqnum_t kv_seqnum = fdb_kvs_get_seqnum(file,
                                                    handle->kvs->id);
        if (doc->seqnum != SEQNUM_NOT_USED &&
            doc->flags & FDB_CUSTOM_SEQNUM) { // User specified own seqnum
            if (kv_seqnum < doc->seqnum) { // track highest seqnum in handle,kv
                handle->seqnum = doc->seqnum;
                fdb_kvs_set_seqnum(file, handle->kvs->id,
                                   handle->seqnum);
            }
            doc->flags &= ~FDB_CUSTOM_SEQNUM; // clear flag for fdb_doc reuse
        } else { // normal monotonically increasing sequence numbers..
            doc->seqnum = ++kv_seqnum;
            handle->seqnum = doc->seqnum; // keep handle's seqnum the highest
            fdb_kvs_set_seqnum(file, handle->kvs->id, handle->seqnum);
        }
    } else {
        fdb_seqnum_t kv_seqnum = filemgr_get_seqnum(file);
        // super handle OR single KV instance mode
        if (doc->seqnum != SEQNUM_NOT_USED &&
            doc->flags & FDB_CUSTOM_SEQNUM) { // User specified own seqnum
            if (kv_seqnum < doc->seqnum) { // track highest seqnum in handle,kv
                handle->seqnum = doc->seqnum;
                filemgr_set_seqnum(file, handle->seqnum);
            }
            doc->flags &= ~FDB_CUSTOM_SEQNUM; // clear flag for fdb_doc reuse
        } else { // normal monotonically increasing sequence numbers..
            doc->seqnum = ++kv_seqnum;
            handle->seqnum = doc->seqnum;
            filemgr_set_seqnum(file, handle->seqnum);
        }
    }
    _doc.seqnum = doc->seqnum;

    if (doc->deleted) {
        // set timestamp
        gettimeofday(&tv, NULL);
        _doc.timestamp = (timestamp_t)tv.tv_sec;
    } else {
        _doc.timestamp = 0;
    }

    if (txn) {
        txn_enabled = true;
    }

    offset = docio_append_doc(dhandle, &_doc, doc->deleted, txn_enabled);
    if (offset == BLK_NOT_FOUND) {
        filemgr_mutex_unlock(file);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_WRITE_FAIL;
    }

    if (doc->deleted && !handle->config.purging_interval) {
        // immediately remove from hbtrie upon WAL flush
        immediate_remove = true;
    }

    doc->size_ondisk = _fdb_get_docsize(_doc.length);
    doc->offset = offset;
    if (!txn) {
        txn = &file->global_txn;
    }

    if (handle->config.bottom_up_index_build) {
        // Bottom-up build mode, bypass WAL.
        struct bottom_up_build_entry* bub_entry =
            (struct bottom_up_build_entry*)
            malloc(sizeof(struct bottom_up_build_entry));
        bub_entry->keylen = _doc.length.keylen;
        bub_entry->key = (void*)malloc(_doc.length.keylen);
        memcpy(bub_entry->key, _doc.key, _doc.length.keylen);
        bub_entry->seqnum = doc->seqnum;
        bub_entry->offset = doc->offset;

        fdb_kvs_handle* root_handle = handle->fhandle->root;
        list_push_back(root_handle->bub_ctx.entries, &bub_entry->le);
        root_handle->bub_ctx.num_entries++;
        root_handle->bub_ctx.space_used += doc->size_ondisk;

    } else {
        if (handle->kvs) {
            // multi KV instance mode
            fdb_doc kv_ins_doc = *doc;
            kv_ins_doc.key = _doc.key;
            kv_ins_doc.keylen = _doc.length.keylen;
            if (!immediate_remove) {
                wal_insert(txn, file, &cmp_info, &kv_ins_doc, offset,
                           WAL_INS_WRITER);
            } else {
                wal_immediate_remove(txn, file, &cmp_info, &kv_ins_doc, offset,
                                     WAL_INS_WRITER);
            }
        } else {
            if (!immediate_remove) {
                wal_insert(txn, file, &cmp_info, doc, offset, WAL_INS_WRITER);
            } else {
                wal_immediate_remove(txn, file, &cmp_info, doc, offset,
                                     WAL_INS_WRITER);
            }
        }

        if (wal_get_dirty_status(file)== FDB_WAL_CLEAN) {
            wal_set_dirty_status(file, FDB_WAL_DIRTY);
        }
    }

    if (handle->config.auto_commit &&
        wal_get_num_flushable(file) > _fdb_get_wal_threshold(handle)) {
        // we don't need dirty WAL flushing in auto commit mode
        // (_fdb_commit() is internally called at the end of this function)
        wal_flushed = true;

    } else if (handle->config.wal_flush_before_commit) {

        bid_t dirty_idtree_root = BLK_NOT_FOUND;
        bid_t dirty_seqtree_root = BLK_NOT_FOUND;

        if (!txn_enabled) {
            handle->dirty_updates = 1;
        }

        if (wal_get_num_flushable(file) > _fdb_get_wal_threshold(handle)) {
            union wal_flush_items flush_items;

            // commit only for non-transactional WAL entries
            wr = wal_commit(&file->global_txn, file, NULL, &handle->log_callback);
            if (wr != FDB_RESULT_SUCCESS) {
                filemgr_mutex_unlock(file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }

            struct filemgr_dirty_update_node *prev_node = NULL, *new_node = NULL;

            _fdb_dirty_update_ready(handle, &prev_node, &new_node,
                                    &dirty_idtree_root, &dirty_seqtree_root, true);

            wr = wal_flush(file, (void *)handle,
                           _fdb_wal_flush_func, _fdb_wal_get_old_offset,
                           _fdb_wal_flush_seq_purge, _fdb_wal_flush_kvs_delta_stats,
                           &flush_items);

            if (wr != FDB_RESULT_SUCCESS) {
                btreeblk_clear_dirty_update(handle->bhandle);
                filemgr_dirty_update_close_node(handle->file, prev_node);
                filemgr_dirty_update_remove_node(handle->file, new_node);
                filemgr_mutex_unlock(file);
                atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
                return wr;
            }

            _fdb_dirty_update_finalize(handle, prev_node, new_node,
                                       &dirty_idtree_root, &dirty_seqtree_root, false);

            wal_set_dirty_status(file, FDB_WAL_PENDING);
            // it is ok to release flushed items becuase
            // these items are not actually committed yet.
            // they become visible after fdb_commit is invoked.
            wal_release_flushed_items(file, &flush_items);

            wal_flushed = true;
            btreeblk_reset_subblock_info(handle->bhandle);
        }
    }

    filemgr_mutex_unlock(file);

    LATENCY_STAT_END(file, FDB_LATENCY_SETS);

    if (!doc->deleted) {
        atomic_incr_uint64_t(&handle->op_stats->num_sets, std::memory_order_relaxed);
    }

    if (wal_flushed && handle->config.auto_commit) {
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return _fdb_commit(handle->fhandle->root, FDB_COMMIT_NORMAL,
                           false); // asynchronous commit only
    }
    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_SUCCESS;
}